

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::drawLines(QPainter *this,QLineF *lines,int lineCount)

{
  qreal *pqVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  QPainterState *pQVar2;
  uint uVar3;
  TransformationType TVar4;
  QPaintEngine *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QPainterPath linePath;
  QLineF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((lineCount < 1) ||
     (this_00._M_head_impl =
           (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
           super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl,
     ((this_00._M_head_impl)->engine)._M_t.
     super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
     super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
     super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0)) {
LAB_003884f0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pQVar5 = &(this_00._M_head_impl)->extended->super_QPaintEngine;
    if (pQVar5 == (QPaintEngine *)0x0) {
      QPainterPrivate::updateState(this_00._M_head_impl,&(this_00._M_head_impl)->state);
      pQVar2 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      uVar3 = pQVar2->emulationSpecifier & 0x50011c81;
      if (uVar3 != 0) {
        if (uVar3 == 1) {
          TVar4 = QTransform::type(&pQVar2->matrix);
          if (TVar4 == TxTranslate) {
            for (lVar6 = 0; (ulong)(uint)lineCount << 5 != lVar6; lVar6 = lVar6 + 0x20) {
              pqVar1 = (qreal *)((long)&(lines->pt1).xp + lVar6);
              local_58.pt1.xp = *pqVar1;
              local_58.pt1.yp = pqVar1[1];
              pqVar1 = (qreal *)((long)&(lines->pt2).xp + lVar6);
              local_58.pt2.xp = *pqVar1;
              local_58.pt2.yp = pqVar1[1];
              pQVar2 = ((this_00._M_head_impl)->state)._M_t.
                       super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                       super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
              QLineF::translate(&local_58,(pQVar2->matrix).m_matrix[2][0],
                                (pQVar2->matrix).m_matrix[2][1]);
              pQVar5 = ((this_00._M_head_impl)->engine)._M_t.
                       super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>
                       .super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
              (*pQVar5->_vptr_QPaintEngine[8])(pQVar5,&local_58,1);
            }
            goto LAB_003884f0;
          }
        }
        linePath.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath(&linePath);
        for (lVar6 = 0; (ulong)(uint)lineCount << 5 != lVar6; lVar6 = lVar6 + 0x20) {
          pqVar1 = (qreal *)((long)&(lines->pt1).xp + lVar6);
          local_58.pt1.xp = *pqVar1;
          local_58.pt1.yp = pqVar1[1];
          QPainterPath::moveTo(&linePath,&local_58.pt1);
          pqVar1 = (qreal *)((long)&(lines->pt2).xp + lVar6);
          local_58.pt1.xp = *pqVar1;
          local_58.pt1.yp = pqVar1[1];
          QPainterPath::lineTo(&linePath,&local_58.pt1);
        }
        QPainterPrivate::draw_helper(this_00._M_head_impl,&linePath,StrokeDraw);
        QPainterPath::~QPainterPath(&linePath);
        goto LAB_003884f0;
      }
      pQVar5 = ((this_00._M_head_impl)->engine)._M_t.
               super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
               super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
               super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*((QPaintEngine *)&pQVar5->_vptr_QPaintEngine)->_vptr_QPaintEngine[8])
                (pQVar5,lines,(ulong)(uint)lineCount);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawLines(const QLineF *lines, int lineCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawLines(), line count=%d\n", lineCount);
#endif

    Q_D(QPainter);

    if (!d->engine || lineCount < 1)
        return;

    if (d->extended) {
        d->extended->drawLines(lines, lineCount);
        return;
    }

    d->updateState(d->state);

    uint lineEmulation = line_emulation(d->state->emulationSpecifier);

    if (lineEmulation) {
        if (lineEmulation == QPaintEngine::PrimitiveTransform
            && d->state->matrix.type() == QTransform::TxTranslate) {
            for (int i = 0; i < lineCount; ++i) {
                QLineF line = lines[i];
                line.translate(d->state->matrix.dx(), d->state->matrix.dy());
                d->engine->drawLines(&line, 1);
            }
        } else {
            QPainterPath linePath;
            for (int i = 0; i < lineCount; ++i) {
                linePath.moveTo(lines[i].p1());
                linePath.lineTo(lines[i].p2());
            }
            d->draw_helper(linePath, QPainterPrivate::StrokeDraw);
        }
        return;
    }
    d->engine->drawLines(lines, lineCount);
}